

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_partition.c
# Opt level: O2

_Bool av1_ext_part_get_partition_decision
                (ExtPartController *ext_part_controller,aom_partition_decision_t *decision)

{
  aom_ext_part_status_t aVar1;
  
  aVar1 = (*(ext_part_controller->funcs).get_partition_decision)
                    (ext_part_controller->model,decision);
  return aVar1 == AOM_EXT_PART_OK;
}

Assistant:

bool av1_ext_part_get_partition_decision(ExtPartController *ext_part_controller,
                                         aom_partition_decision_t *decision) {
  assert(ext_part_controller != NULL);
  assert(ext_part_controller->ready);
  assert(decision != NULL);
  const aom_ext_part_status_t status =
      ext_part_controller->funcs.get_partition_decision(
          ext_part_controller->model, decision);
  if (status != AOM_EXT_PART_OK) return false;
  return true;
}